

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

void __thiscall Expression::adjustOperators(Expression *this)

{
  ExpressionSymbol *pEVar1;
  _Self it;
  _Self local_48;
  
  local_48._M_cur =
       (this->m_symbols)._deque.
       super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_48._M_first =
       (this->m_symbols)._deque.
       super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_48._M_last =
       (this->m_symbols)._deque.
       super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_48._M_node =
       (this->m_symbols)._deque.
       super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  std::operator+(&it,&local_48,1);
  while (it._M_cur !=
         (this->m_symbols)._deque.
         super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur) {
    pEVar1 = *it._M_cur;
    if ((pEVar1->m_type == EXPRSYM_Operator) && ((char)pEVar1[1].m_type == EXPRSYM_Value)) {
      std::operator-(&local_48,&it,1);
      if ((*local_48._M_cur)->m_type == EXPRSYM_Value) {
        *(undefined1 *)&pEVar1[1].m_type = 6;
      }
    }
    it._M_cur = it._M_cur + 1;
    if (it._M_cur == it._M_last) {
      it._M_cur = it._M_node[1];
      it._M_last = it._M_cur + 0x40;
      it._M_first = it._M_cur;
      it._M_node = it._M_node + 1;
    }
  }
  return;
}

Assistant:

void Expression::adjustOperators()
{
	for (auto it = m_symbols.begin() + 1; it != m_symbols.end(); ++it)
	{
		if ((*it)->type() != EXPRSYM_Operator)
			continue;

		ExpressionOperator* op = static_cast<ExpressionOperator*> (*it);

		// Unary minus with a value as the previous symbol cannot really be
		// unary; replace with binary minus.
		if (op->id() == OPER_UnaryMinus and (*(it - 1))->type() == EXPRSYM_Value)
			op->setID (OPER_Subtraction);
	}
}